

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cost_enc.c
# Opt level: O3

void VP8CalculateLevelCosts(VP8EncProba *proba)

{
  byte bVar1;
  uint16_t uVar2;
  ushort uVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  uint uVar6;
  uint8_t (*pauVar7) [11];
  long lVar8;
  uint16_t **ppuVar9;
  uint16_t uVar10;
  uint8_t *puVar11;
  CostArray *paauVar12;
  long lVar13;
  uint16_t (*pauVar14) [68];
  long lVar15;
  uint16_t (*pauVar16) [68];
  long lVar17;
  uint16_t **ppuVar18;
  short sVar19;
  CostArray (*paaauVar20) [8];
  uint8_t *puVar21;
  uint8_t *puVar22;
  uint8_t *puVar23;
  uint uVar24;
  ulong uVar25;
  undefined1 auVar26 [16];
  
  auVar5 = _DAT_001b1a60;
  auVar4 = _DAT_001b1870;
  if (proba->dirty_ != 0) {
    puVar23 = proba->coeffs_[0][0][0] + 2;
    ppuVar18 = proba->remapped_costs_[0][0] + 1;
    pauVar14 = proba->level_cost_[0][0] + 1;
    lVar13 = 0;
    paaauVar20 = proba->level_cost_;
    do {
      lVar8 = 0;
      puVar22 = puVar23;
      do {
        lVar15 = 0;
        puVar21 = puVar22;
        do {
          pauVar7 = proba->coeffs_[lVar13][lVar8] + lVar15;
          if (lVar15 == 0) {
            uVar10 = 0;
          }
          else {
            uVar10 = VP8EntropyCost[(*pauVar7)[0] ^ 0xff];
          }
          pauVar16 = proba->level_cost_[lVar13][lVar8] + lVar15;
          bVar1 = (*pauVar7)[1];
          uVar2 = VP8EntropyCost[(byte)~bVar1];
          (*pauVar16)[0] = uVar10 + VP8EntropyCost[bVar1];
          lVar17 = 1;
          do {
            uVar3 = VP8FixedCostsI4[9][9][lVar17 * 2 + 8];
            uVar25 = (ulong)uVar3;
            if (uVar3 == 0) {
              sVar19 = 0;
            }
            else {
              uVar6 = (uint)VP8FixedCostsI4[9][9][lVar17 * 2 + 9];
              sVar19 = 0;
              puVar11 = puVar21;
              do {
                if ((uVar25 & 1) != 0) {
                  sVar19 = sVar19 + VP8EntropyCost[(byte)(-((byte)uVar6 & 1) ^ *puVar11)];
                }
                uVar6 = uVar6 >> 1;
                uVar24 = (uint)uVar25;
                uVar25 = uVar25 >> 1;
                puVar11 = puVar11 + 1;
              } while (1 < uVar24);
            }
            (*pauVar16)[lVar17] = sVar19 + uVar2 + uVar10;
            lVar17 = lVar17 + 1;
          } while (lVar17 != 0x44);
          lVar15 = lVar15 + 1;
          puVar21 = puVar21 + 0xb;
        } while (lVar15 != 3);
        lVar8 = lVar8 + 1;
        puVar22 = puVar22 + 0x21;
      } while (lVar8 != 8);
      lVar8 = 0;
      ppuVar9 = ppuVar18;
      do {
        pauVar16 = pauVar14 + (ulong)""[lVar8] * 3;
        paauVar12 = *paaauVar20 + ""[lVar8];
        lVar15 = 0;
        auVar26 = auVar4;
        do {
          if (SUB164(auVar26 ^ auVar5,4) == -0x80000000 && SUB164(auVar26 ^ auVar5,0) < -0x7ffffffd)
          {
            ppuVar9[lVar15 + -1] = (uint16_t *)paauVar12;
            ppuVar9[lVar15] = *pauVar16;
          }
          lVar15 = lVar15 + 2;
          lVar17 = auVar26._8_8_;
          auVar26._0_8_ = auVar26._0_8_ + 2;
          auVar26._8_8_ = lVar17 + 2;
          pauVar16 = pauVar16 + 2;
          paauVar12 = (CostArray *)(*paauVar12 + 2);
        } while (lVar15 != 4);
        lVar8 = lVar8 + 1;
        ppuVar9 = ppuVar9 + 3;
      } while (lVar8 != 0x10);
      lVar13 = lVar13 + 1;
      puVar23 = puVar23 + 0x108;
      ppuVar18 = ppuVar18 + 0x30;
      pauVar14 = pauVar14 + 0x18;
      paaauVar20 = paaauVar20 + 1;
    } while (lVar13 != 4);
    proba->dirty_ = 0;
  }
  return;
}

Assistant:

void VP8CalculateLevelCosts(VP8EncProba* const proba) {
  int ctype, band, ctx;

  if (!proba->dirty_) return;  // nothing to do.

  for (ctype = 0; ctype < NUM_TYPES; ++ctype) {
    int n;
    for (band = 0; band < NUM_BANDS; ++band) {
      for (ctx = 0; ctx < NUM_CTX; ++ctx) {
        const uint8_t* const p = proba->coeffs_[ctype][band][ctx];
        uint16_t* const table = proba->level_cost_[ctype][band][ctx];
        const int cost0 = (ctx > 0) ? VP8BitCost(1, p[0]) : 0;
        const int cost_base = VP8BitCost(1, p[1]) + cost0;
        int v;
        table[0] = VP8BitCost(0, p[1]) + cost0;
        for (v = 1; v <= MAX_VARIABLE_LEVEL; ++v) {
          table[v] = cost_base + VariableLevelCost(v, p);
        }
        // Starting at level 67 and up, the variable part of the cost is
        // actually constant.
      }
    }
    for (n = 0; n < 16; ++n) {    // replicate bands. We don't need to sentinel.
      for (ctx = 0; ctx < NUM_CTX; ++ctx) {
        proba->remapped_costs_[ctype][n][ctx] =
            proba->level_cost_[ctype][VP8EncBands[n]][ctx];
      }
    }
  }
  proba->dirty_ = 0;
}